

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::AddTapscriptSignTxInRequest::AddTapscriptSignTxInRequest
          (AddTapscriptSignTxInRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::AddTapscriptSignTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__AddTapscriptSignTxInRequest_00a7d5f0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->txid_)._M_dataplus._M_p = (pointer)&(this->txid_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->txid_,"");
  this->vout_ = 0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::TapScriptSignData>.
  super_vector<cfd::js::api::json::TapScriptSignData,_std::allocator<cfd::js::api::json::TapScriptSignData>_>
  .
  super__Vector_base<cfd::js::api::json::TapScriptSignData,_std::allocator<cfd::js::api::json::TapScriptSignData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::TapScriptSignData>.
  super_vector<cfd::js::api::json::TapScriptSignData,_std::allocator<cfd::js::api::json::TapScriptSignData>_>
  .
  super__Vector_base<cfd::js::api::json::TapScriptSignData,_std::allocator<cfd::js::api::json::TapScriptSignData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::TapScriptSignData>.
  super_vector<cfd::js::api::json::TapScriptSignData,_std::allocator<cfd::js::api::json::TapScriptSignData>_>
  .
  super__Vector_base<cfd::js::api::json::TapScriptSignData,_std::allocator<cfd::js::api::json::TapScriptSignData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::TapScriptSignData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a7d688;
  (this->tapscript_)._M_dataplus._M_p = (pointer)&(this->tapscript_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->tapscript_,"");
  (this->control_block_)._M_dataplus._M_p = (pointer)&(this->control_block_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->control_block_,"");
  (this->annex_)._M_dataplus._M_p = (pointer)&(this->annex_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->annex_,"");
  CollectFieldName();
  return;
}

Assistant:

AddTapscriptSignTxInRequest() {
    CollectFieldName();
  }